

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O0

void rt_shaded1col(int hx,int sx,int yl,int yh)

{
  int iVar1;
  lighttable_t *plVar2;
  uint uVar3;
  long lVar4;
  DWORD fg;
  DWORD val;
  int pitch;
  int count;
  BYTE *dest;
  BYTE *source;
  BYTE *colormap;
  DWORD *fgstart;
  int yh_local;
  int yl_local;
  int sx_local;
  int hx_local;
  
  plVar2 = dc_colormap;
  iVar1 = dc_pitch;
  if (-1 < yh - yl) {
    val = (yh - yl) + 1;
    lVar4 = (long)dc_color;
    _pitch = dc_destorg + (ylookup[yl] + sx);
    dest = dc_temp + (yl * 4 + hx);
    do {
      uVar3 = Col2RGB8[0x40 - plVar2[*dest]][*_pitch] + Col2RGB8[plVar2[*dest]][lVar4] | 0x1f07c1f;
      *_pitch = RGB32k.All[uVar3 & uVar3 >> 0xf];
      dest = dest + 4;
      _pitch = _pitch + iVar1;
      val = val - 1;
    } while (val != 0);
  }
  return;
}

Assistant:

void rt_shaded1col (int hx, int sx, int yl, int yh)
{
	DWORD *fgstart;
	BYTE *colormap;
	BYTE *source;
	BYTE *dest;
	int count;
	int pitch;

	count = yh-yl;
	if (count < 0)
		return;
	count++;

	fgstart = &Col2RGB8[0][dc_color];
	colormap = dc_colormap;
	dest = ylookup[yl] + sx + dc_destorg;
	source = &dc_temp[yl*4 + hx];
	pitch = dc_pitch;

	do {
		DWORD val = colormap[*source];
		DWORD fg = fgstart[val<<8];
		val = (Col2RGB8[64-val][*dest] + fg) | 0x1f07c1f;
		*dest = RGB32k.All[val & (val>>15)];
		source += 4;
		dest += pitch;
	} while (--count);
}